

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::get_remainder(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                *__return_storage_ptr__,
               RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *this,size_t in_times_split)

{
  unsigned_long uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (in_times_split <
      (ulong)((long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tokens).
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    uVar1 = (this->m_token_indexes).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[in_times_split];
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    replace(__return_storage_ptr__,0,0,(this->m_str)._M_dataplus._M_p + uVar1,
            (this->m_str)._M_string_length - uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}